

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

void Abc_FrameReplacePoEquivs(Abc_Frame_t *pAbc,Vec_Ptr_t **pvPoEquivs)

{
  Vec_Ptr_t *__ptr;
  void *__ptr_00;
  int iVar1;
  long lVar2;
  
  __ptr = pAbc->vPoEquivs;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    iVar1 = __ptr->nSize;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        __ptr_00 = __ptr->pArray[lVar2];
        if (__ptr_00 != (void *)0x0) {
          if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr_00 + 8));
          }
          free(__ptr_00);
          iVar1 = __ptr->nSize;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  pAbc->vPoEquivs = *pvPoEquivs;
  *pvPoEquivs = (Vec_Ptr_t *)0x0;
  return;
}

Assistant:

void Abc_FrameReplacePoEquivs( Abc_Frame_t * pAbc, Vec_Ptr_t ** pvPoEquivs )
{
    if ( pAbc->vPoEquivs )
        Vec_VecFree( (Vec_Vec_t *)pAbc->vPoEquivs );
    pAbc->vPoEquivs = *pvPoEquivs;
    *pvPoEquivs = NULL;
}